

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

void print_dict(ObjDict *dict,_Bool new_line)

{
  undefined4 type;
  undefined4 uVar2;
  HTItem **ppHVar1;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  CrispyValue value;
  HTItemKey *local_58;
  HTItem *bucket;
  uint32_t i;
  _Bool first;
  HashTable ht;
  char *tab;
  char *nl;
  _Bool new_line_local;
  ObjDict *dict_local;
  
  pcVar4 = "";
  if (new_line) {
    pcVar4 = "\n";
  }
  pcVar5 = "";
  if (new_line) {
    pcVar5 = "\t";
  }
  type = (dict->content).key_type;
  uVar2 = (dict->content).cap;
  ppHVar1 = (dict->content).buckets;
  printf("{%s",pcVar4);
  bVar3 = true;
  for (bucket._0_4_ = 0; (uint)bucket < (uint)uVar2; bucket._0_4_ = (uint)bucket + 1) {
    for (local_58 = &ppHVar1[(uint)bucket]->key; local_58 != (HTItemKey *)0x0;
        local_58 = (HTItemKey *)local_58[2].key_obj_string) {
      if (bVar3) {
        bVar3 = false;
      }
      else {
        printf(", ");
      }
      printf("%s\"",pcVar5);
      print_ht_key(type,*local_58);
      printf("\": ");
      value._4_4_ = 0;
      value.type = local_58[1].key_int;
      value.field_1.p_value =
           ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)((long)local_58 + 0x18))->p_value;
      print_value(value,new_line,true);
    }
  }
  printf("}%s",pcVar4);
  return;
}

Assistant:

void print_dict(ObjDict *dict, bool new_line) {
    const char *nl = (new_line) ? "\n" : "";
    const char *tab = (new_line) ? "\t" : "";

    HashTable ht = dict->content;

    printf("{%s", nl);
    bool first = true;

    for (uint32_t i = 0; i < ht.cap; ++i) {
        HTItem *bucket = ht.buckets[i];
        while (bucket) {
            if (first) {
                first = false;
            } else {
                printf(", ");
            }
            printf("%s\"", tab);
            print_ht_key(ht.key_type, bucket->key);
            printf("\": ");
            print_value(bucket->value, new_line, true);

            bucket = bucket->next;
        }
    }

    printf("}%s", nl);
}